

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_view_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitTest_x_iutest_x_PrintStringView_Test::Body(iu_UnitTest_x_iutest_x_PrintStringView_Test *this)

{
  iu_basic_string_view<char,_std::char_traits<char>_> val;
  bool bVar1;
  char *pcVar2;
  Fixed *fixed;
  iu_basic_string_view<char,_std::char_traits<char>_> *v;
  type **in_stack_fffffffffffffb78;
  AssertionHelper local_448;
  const_pointer local_418;
  const_pointer pvStack_410;
  Fixed local_400;
  AssertionHelper local_278;
  Fixed local_248;
  string local_c0;
  undefined1 local_a0 [8];
  AssertionResult iutest_ar;
  undefined1 auStack_68 [8];
  iu_string_view view;
  LogChecker ck;
  iu_UnitTest_x_iutest_x_PrintStringView_Test *this_local;
  
  LogChecker::LogChecker((LogChecker *)&view.m_size,"XYZ");
  iutest::detail::iu_basic_string_view<char,_std::char_traits<char>_>::iu_basic_string_view
            ((iu_basic_string_view<char,_std::char_traits<char>_> *)auStack_68,"XYZ");
  iutest::detail::AlwaysZero();
  pcVar2 = LogCheckerBase::operator_cast_to_char_((LogCheckerBase *)&view.m_size);
  iutest::PrintToString<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>>
            (&local_c0,(iutest *)auStack_68,v);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_a0,(internal *)"static_cast<const char*>(ck)",
             "::iutest::PrintToString(view)",pcVar2,(char *)&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffb78);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    memset(&local_248,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_248);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_a0);
    iutest::AssertionHelper::AssertionHelper
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
               ,0x5d,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_278,&local_248);
    iutest::AssertionHelper::~AssertionHelper(&local_278);
    iutest::AssertionHelper::Fixed::~Fixed(&local_248);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  memset(&local_400,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_400);
  local_418 = (const_pointer)auStack_68;
  pvStack_410 = view.m_data;
  val.m_size = (size_type)view.m_data;
  val.m_data = (const_pointer)auStack_68;
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_400,val);
  iutest::AssertionHelper::AssertionHelper
            (&local_448,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
             ,0x5e,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_448,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_448);
  iutest::AssertionHelper::Fixed::~Fixed(&local_400);
  LogChecker::~LogChecker((LogChecker *)&view.m_size);
  return;
}

Assistant:

IUTEST(UnitTest, PrintStringView)
{
    LogChecker ck("XYZ");
    ::iutest::detail::iu_string_view view = "XYZ";
    IUTEST_PRINTTOSTRING_EQ(ck, view);
    IUTEST_STREAMOUT_CHECK(view);
}